

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::create_oneof_node(CTcEmbedBuilder *b,CTPNList *lst,char *attrs)

{
  int iVar1;
  tc_symtype_t tVar2;
  undefined4 uVar3;
  CTcSymObj *pCVar4;
  CTcSymbol *this;
  CTcSymObj *in_RDX;
  CTcParser *in_RSI;
  undefined8 *in_RDI;
  CTcSymbol *cls;
  CTcSymObj *obj;
  textchar_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffb8;
  CTcParser *pCVar5;
  int dstr;
  CTcSymObj *in_stack_ffffffffffffffc0;
  CTcParser *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd8;
  CTcSymObj *prop;
  
  dstr = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  iVar1 = CTcParser::get_syntax_only(G_prs);
  if (iVar1 == 0) {
    pCVar4 = CTcParser::add_gen_obj(in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0);
    if (pCVar4 == (CTcSymObj *)0x0) {
      CTcParser::get_global_symtab(G_prs);
      this = CTcPrsSymtab::find((CTcPrsSymtab *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffa8,0x2a91c7);
      if ((this == (CTcSymbol *)0x0) ||
         (tVar2 = CTcSymbolBase::get_type(&this->super_CTcSymbolBase), tVar2 != TC_SYM_OBJ)) {
        CTcTokenizer::log_error(0x2d2b);
      }
    }
    else {
      pCVar5 = G_prs;
      prop = pCVar4;
      CTPNListBase::get_count((CTPNListBase *)in_RSI);
      dstr = (int)((ulong)pCVar5 >> 0x20);
      CTcParser::add_gen_obj_prop
                (in_RSI,in_RDX,(char *)prop,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
      CTcParser::add_gen_obj_prop(in_RSI,in_RDX,(char *)prop,in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffc0 = pCVar4;
    }
  }
  pCVar4 = (CTcSymObj *)CTcPrsAllocObj::operator_new(0x2a91fd);
  uVar3 = (**(code **)*in_RDI)();
  CTPNStrOneOf::CTPNStrOneOf
            ((CTPNStrOneOf *)in_stack_ffffffffffffffc0,dstr,
             (CTPNList *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),pCVar4);
  return (CTcPrsNode *)pCVar4;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::create_oneof_node(
    CTcEmbedBuilder *b, CTPNList *lst, const char *attrs)
{
    /*
     *   If we're actually compiling (not just doing a symbol extraction
     *   pass), create our list state object.  This is an anonymous
     *   TadsObject of class OneOfIndexGen, with the following properties:
     *   
     *.    numItems = number of items in the list (integer)
     *.    listAttrs = our 'attrs' list attributes value (string)
     */
    CTcSymObj *obj = 0;
    if (!G_prs->get_syntax_only())
    {
        /* geneate our anonymous OneOfIndexGen instance */
        obj = G_prs->add_gen_obj("OneOfIndexGen");
        if (obj != 0)
        {
            G_prs->add_gen_obj_prop(obj, "numItems", lst->get_count());
            G_prs->add_gen_obj_prop(obj, "listAttrs", attrs);
        }
        else
        {
            /* check to see if OneOfIndexGen is undefined */
            CTcSymbol *cls = G_prs->get_global_symtab()->find(
                "OneOfIndexGen", 13);
            if (cls == 0 || cls->get_type() != TC_SYM_OBJ)
                G_tok->log_error(TCERR_ONEOF_REQ_GENCLS);
        }
    }

    /* return the <<one of>> node */
    return new CTPNStrOneOf(b->is_double(), lst, obj);
}